

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catch.hpp
# Opt level: O0

TrackedSection * __thiscall
Catch::SectionTracking::TrackedSection::acquireChild(TrackedSection *this,string *childName)

{
  TrackedSection *__x;
  TrackedSection local_108;
  pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Catch::SectionTracking::TrackedSection>
  local_a8;
  TrackedSection *local_28;
  TrackedSection *child;
  string *childName_local;
  TrackedSection *this_local;
  
  child = (TrackedSection *)childName;
  childName_local = &this->m_name;
  local_28 = findChild(this,childName);
  __x = child;
  this_local = local_28;
  if (local_28 == (TrackedSection *)0x0) {
    TrackedSection(&local_108,&child->m_name,this);
    std::make_pair<std::__cxx11::string_const&,Catch::SectionTracking::TrackedSection>
              (&local_a8,&__x->m_name,&local_108);
    std::
    map<std::__cxx11::string,Catch::SectionTracking::TrackedSection,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,Catch::SectionTracking::TrackedSection>>>
    ::insert<std::pair<std::__cxx11::string,Catch::SectionTracking::TrackedSection>>
              ((map<std::__cxx11::string,Catch::SectionTracking::TrackedSection,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,Catch::SectionTracking::TrackedSection>>>
                *)&this->m_children,&local_a8);
    std::
    pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Catch::SectionTracking::TrackedSection>
    ::~pair(&local_a8);
    ~TrackedSection(&local_108);
    this_local = findChild(this,&child->m_name);
  }
  return this_local;
}

Assistant:

inline TrackedSection* TrackedSection::acquireChild( std::string const& childName ) {
        if( TrackedSection* child = findChild( childName ) )
            return child;
        m_children.insert( std::make_pair( childName, TrackedSection( childName, this ) ) );
        return findChild( childName );
    }